

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int mbedtls_x509_info_subject_alt_name
              (char **buf,size_t *size,mbedtls_x509_sequence *subject_alt_name,char *prefix)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  size_t size_00;
  char *pcVar7;
  mbedtls_asn1_named_data *pmVar8;
  char *__s;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  undefined1 auStack_98 [8];
  mbedtls_x509_subject_alternative_name san;
  int local_34;
  
  uVar10 = *size;
  __s = *buf;
  if (subject_alt_name != (mbedtls_x509_sequence *)0x0) {
    do {
      san.san.directory_name.next = (mbedtls_asn1_named_data *)0x0;
      san.san._56_8_ = 0;
      san.san.directory_name.val.len = 0;
      san.san.directory_name.val.p = (uchar *)0x0;
      san.san.other_name.type_id.p = (uchar *)0x0;
      san.san._24_8_ = 0;
      san.san._0_8_ = 0;
      san.san.other_name.type_id.len = 0;
      auStack_98 = (undefined1  [8])0x0;
      san.type = 0;
      san._4_4_ = 0;
      iVar1 = mbedtls_x509_parse_subject_alt_name
                        (&subject_alt_name->buf,(mbedtls_x509_subject_alternative_name *)auStack_98)
      ;
      if (iVar1 == -0x2080) {
        pcVar7 = "\n%s    <unsupported>";
LAB_0021352c:
        uVar2 = snprintf(__s,uVar10,pcVar7,prefix);
        if ((int)uVar2 < 0) {
          return -0x2980;
        }
        uVar9 = (ulong)uVar2;
        if (uVar10 <= uVar9) {
          return -0x2980;
        }
        uVar10 = uVar10 - uVar9;
        __s = __s + uVar9;
        goto LAB_00213555;
      }
      if (iVar1 != 0) {
        pcVar7 = "\n%s    <malformed>";
        goto LAB_0021352c;
      }
      switch((ulong)auStack_98 & 0xffffffff) {
      case 0:
        uVar2 = snprintf(__s,uVar10,"\n%s    otherName :",prefix);
        if ((int)uVar2 < 0) {
LAB_00213a5c:
          bVar11 = false;
          local_34 = -0x2980;
        }
        else {
          uVar6 = (ulong)uVar2;
          uVar9 = uVar10 - uVar6;
          if (uVar10 < uVar6 || uVar9 == 0) goto LAB_00213a5c;
          __s = __s + uVar6;
          bVar11 = true;
          uVar10 = uVar9;
          if ((san.san._0_8_ == 8) && (*(long *)san.san.other_name.type_id.len == 0x40807050501062b)
             ) {
            uVar2 = snprintf(__s,uVar9,"\n%s        hardware module name :",prefix);
            if (-1 < (int)uVar2) {
              uVar6 = (ulong)uVar2;
              uVar10 = uVar9 - uVar6;
              if (uVar9 < uVar6 || uVar10 == 0) {
LAB_00213a81:
                bVar11 = false;
                uVar10 = uVar9;
                local_34 = -0x2980;
                goto joined_r0x0021394f;
              }
              __s = __s + uVar6;
              uVar2 = snprintf(__s,uVar10,"\n%s            hardware type          : ",prefix);
              if (-1 < (int)uVar2) {
                uVar6 = (ulong)uVar2;
                uVar9 = uVar10 - uVar6;
                if (uVar6 <= uVar10 && uVar9 != 0) {
                  __s = __s + uVar6;
                  uVar2 = mbedtls_oid_get_numeric_string
                                    (__s,uVar9,(mbedtls_asn1_buf *)&san.san.directory_name.oid.p);
                  uVar10 = uVar9;
                  if (-1 < (int)uVar2) {
                    uVar6 = (ulong)uVar2;
                    uVar10 = uVar9 - uVar6;
                    if (uVar9 < uVar6 || uVar10 == 0) goto LAB_00213a81;
                    __s = __s + uVar6;
                    uVar2 = snprintf(__s,uVar10,"\n%s            hardware serial number : ",prefix);
                    if (-1 < (int)uVar2) {
                      uVar9 = (ulong)uVar2;
                      uVar6 = uVar10 - uVar9;
                      if (uVar9 <= uVar10 && uVar6 != 0) {
                        __s = __s + uVar9;
                        if (san.san.directory_name.next != (mbedtls_asn1_named_data *)0x0) {
                          pmVar8 = (mbedtls_asn1_named_data *)0x0;
                          uVar9 = uVar6;
                          do {
                            uVar2 = snprintf(__s,uVar9,"%02X",
                                             (ulong)*(byte *)((long)&(pmVar8->oid).tag +
                                                             san.san._56_8_));
                            uVar10 = uVar9;
                            if ((int)uVar2 < 0) goto LAB_00213a5c;
                            uVar10 = (ulong)uVar2;
                            uVar6 = uVar9 - uVar10;
                            if (uVar9 < uVar10 || uVar6 == 0) goto LAB_00213a81;
                            __s = __s + uVar10;
                            pmVar8 = (mbedtls_asn1_named_data *)((long)&(pmVar8->oid).tag + 1);
                            uVar9 = uVar6;
                          } while (pmVar8 < san.san.directory_name.next);
                        }
                        bVar11 = true;
                        uVar10 = uVar6;
                        goto joined_r0x0021394f;
                      }
                    }
                  }
                }
              }
            }
            goto LAB_00213a5c;
          }
        }
        goto joined_r0x0021394f;
      case 1:
      case 2:
        pcVar7 = "rfc822Name";
        if (auStack_98._0_4_ == 2) {
          pcVar7 = "dNSName";
        }
        uVar2 = snprintf(__s,uVar10,"\n%s    %s : ",prefix,pcVar7);
        iVar1 = -0x2980;
        if (-1 < (int)uVar2) {
          uVar9 = (ulong)uVar2;
          uVar6 = uVar10 - uVar9;
          if (uVar9 <= uVar10 && uVar6 != 0) {
            __s = __s + uVar9;
            if (uVar6 <= (ulong)san.san._0_8_) {
              if (uVar6 != 0) {
                *__s = '\0';
              }
              bVar11 = false;
              uVar10 = uVar6;
              local_34 = -0x2980;
              goto joined_r0x0021394f;
            }
            memcpy(__s,(void *)san.san.other_name.type_id.len,san.san._0_8_);
            __s = __s + san.san._0_8_;
            uVar10 = uVar6 - san.san._0_8_;
LAB_0021392e:
            bVar11 = true;
            goto joined_r0x0021394f;
          }
        }
        goto LAB_00213947;
      default:
        uVar2 = snprintf(__s,uVar10,"\n%s    <unsupported>",prefix);
        if ((int)uVar2 < 0) {
          return -0x2980;
        }
        uVar9 = (ulong)uVar2;
        bVar11 = uVar10 < uVar9;
        uVar10 = uVar10 - uVar9;
        if (bVar11 || uVar10 == 0) {
          return -0x2980;
        }
        __s = __s + uVar9;
        break;
      case 4:
        uVar2 = snprintf(__s,uVar10,"\n%s    directoryName : ",prefix);
        uVar9 = (ulong)uVar2;
        if ((uVar10 <= uVar9 || (int)uVar2 < 0) && (auStack_98._0_4_ == 4)) {
          mbedtls_asn1_free_named_data_list_shallow
                    ((mbedtls_asn1_named_data *)san.san.directory_name.val.p);
        }
        if ((int)uVar2 < 0) {
          return -0x2980;
        }
        size_00 = uVar10 - uVar9;
        if (uVar10 < uVar9 || size_00 == 0) {
          return -0x2980;
        }
        __s = __s + uVar9;
        san.san._64_8_ = uVar9;
        uVar2 = mbedtls_x509_dn_gets(__s,size_00,(mbedtls_x509_name *)&san);
        uVar4 = san.san._64_8_;
        uVar5 = ZEXT48(uVar2);
        if ((int)uVar2 < 0) {
          if (auStack_98._0_4_ == 4) {
            mbedtls_asn1_free_named_data_list_shallow
                      ((mbedtls_asn1_named_data *)san.san.directory_name.val.p);
          }
          goto joined_r0x00213ae2;
        }
        __s = __s + uVar5;
LAB_00213827:
        uVar10 = size_00 - uVar5;
        break;
      case 6:
        uVar3 = snprintf(__s,uVar10,"\n%s    uniformResourceIdentifier : ",prefix);
        uVar2 = 0xffffd680;
        if ((int)uVar3 < 0) {
          return 0xffffd680;
        }
        uVar4 = ZEXT48(uVar3);
        size_00 = uVar10 - uVar4;
        if (uVar10 < (ulong)uVar4 || size_00 == 0) {
          return 0xffffd680;
        }
        __s = __s + uVar4;
        if ((ulong)san.san._0_8_ < size_00) {
          memcpy(__s,(void *)san.san.other_name.type_id.len,san.san._0_8_);
          __s = __s + san.san._0_8_;
          uVar5 = san.san._0_8_;
          goto LAB_00213827;
        }
joined_r0x00213ae2:
        if (uVar10 == uVar4) {
          return uVar2;
        }
LAB_00213aeb:
        *__s = '\0';
        return uVar2;
      case 7:
        uVar3 = snprintf(__s,uVar10,"\n%s    %s : ",prefix,"iPAddress");
        iVar1 = -0x2980;
        uVar2 = 0xffffd680;
        if ((int)uVar3 < 0) {
          return -0x2980;
        }
        uVar9 = (ulong)uVar3;
        bVar11 = uVar10 < uVar9;
        uVar10 = uVar10 - uVar9;
        if (bVar11 || uVar10 == 0) {
          return -0x2980;
        }
        __s = __s + uVar9;
        if (uVar10 <= (ulong)san.san._0_8_) {
          if (uVar10 == 0) {
            return -0x2980;
          }
          goto LAB_00213aeb;
        }
        if (san.san._0_8_ == 0x10) {
          san.san._64_8_ = ZEXT18(*(byte *)(san.san.other_name.type_id.len + 4));
          uVar2 = snprintf(__s,uVar10,"%X%X:%X%X:%X%X:%X%X:%X%X:%X%X:%X%X:%X%X",
                           (ulong)*(byte *)san.san.other_name.type_id.len,
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 1),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 2),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 3),san.san._64_8_,
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 5),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 6),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 7),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 8),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 9),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 10),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 0xb),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 0xc),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 0xd),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 0xe),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 0xf));
          if ((-1 < (int)uVar2) && (uVar9 = (ulong)uVar2, uVar9 < uVar10)) {
LAB_00213928:
            uVar10 = uVar10 - uVar9;
            __s = __s + uVar9;
            goto LAB_0021392e;
          }
          iVar1 = -0x2980;
        }
        else if (san.san._0_8_ == 4) {
          uVar2 = snprintf(__s,uVar10,"%u.%u.%u.%u",(ulong)*(byte *)san.san.other_name.type_id.len,
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 1),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 2),
                           (ulong)*(byte *)(san.san.other_name.type_id.len + 3));
          if ((-1 < (int)uVar2) && (uVar9 = (ulong)uVar2, uVar9 < uVar10)) goto LAB_00213928;
        }
        else {
          *__s = '\0';
          iVar1 = -0x2800;
        }
LAB_00213947:
        bVar11 = false;
        local_34 = iVar1;
joined_r0x0021394f:
        if (!bVar11) {
          return local_34;
        }
      }
      if (auStack_98._0_4_ == 4) {
        mbedtls_asn1_free_named_data_list_shallow
                  ((mbedtls_asn1_named_data *)san.san.directory_name.val.p);
      }
LAB_00213555:
      subject_alt_name = subject_alt_name->next;
    } while (subject_alt_name != (mbedtls_asn1_sequence *)0x0);
  }
  *__s = '\0';
  *size = uVar10;
  *buf = __s;
  return 0;
}

Assistant:

int mbedtls_x509_info_subject_alt_name(char **buf, size_t *size,
                                       const mbedtls_x509_sequence
                                       *subject_alt_name,
                                       const char *prefix)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    size_t n = *size;
    char *p = *buf;
    const mbedtls_x509_sequence *cur = subject_alt_name;
    mbedtls_x509_subject_alternative_name san;
    int parse_ret;

    while (cur != NULL) {
        memset(&san, 0, sizeof(san));
        parse_ret = mbedtls_x509_parse_subject_alt_name(&cur->buf, &san);
        if (parse_ret != 0) {
            if (parse_ret == MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE) {
                ret = mbedtls_snprintf(p, n, "\n%s    <unsupported>", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;
            } else {
                ret = mbedtls_snprintf(p, n, "\n%s    <malformed>", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;
            }
            cur = cur->next;
            continue;
        }

        switch (san.type) {
            /*
             * otherName
             */
            case MBEDTLS_X509_SAN_OTHER_NAME:
            {
                mbedtls_x509_san_other_name *other_name = &san.san.other_name;

                ret = mbedtls_snprintf(p, n, "\n%s    otherName :", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;

                if (MBEDTLS_OID_CMP(MBEDTLS_OID_ON_HW_MODULE_NAME,
                                    &other_name->type_id) == 0) {
                    ret = mbedtls_snprintf(p, n, "\n%s        hardware module name :", prefix);
                    MBEDTLS_X509_SAFE_SNPRINTF;
                    ret =
                        mbedtls_snprintf(p, n, "\n%s            hardware type          : ", prefix);
                    MBEDTLS_X509_SAFE_SNPRINTF;

                    ret = mbedtls_oid_get_numeric_string(p,
                                                         n,
                                                         &other_name->value.hardware_module_name.oid);
                    MBEDTLS_X509_SAFE_SNPRINTF;

                    ret =
                        mbedtls_snprintf(p, n, "\n%s            hardware serial number : ", prefix);
                    MBEDTLS_X509_SAFE_SNPRINTF;

                    for (i = 0; i < other_name->value.hardware_module_name.val.len; i++) {
                        ret = mbedtls_snprintf(p,
                                               n,
                                               "%02X",
                                               other_name->value.hardware_module_name.val.p[i]);
                        MBEDTLS_X509_SAFE_SNPRINTF;
                    }
                }/* MBEDTLS_OID_ON_HW_MODULE_NAME */
            }
            break;
            /*
             * uniformResourceIdentifier
             */
            case MBEDTLS_X509_SAN_UNIFORM_RESOURCE_IDENTIFIER:
            {
                ret = mbedtls_snprintf(p, n, "\n%s    uniformResourceIdentifier : ", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;
                if (san.san.unstructured_name.len >= n) {
                    if (n > 0) {
                        *p = '\0';
                    }
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }

                memcpy(p, san.san.unstructured_name.p, san.san.unstructured_name.len);
                p += san.san.unstructured_name.len;
                n -= san.san.unstructured_name.len;
            }
            break;
            /*
             * dNSName
             * RFC822 Name
             */
            case MBEDTLS_X509_SAN_DNS_NAME:
            case MBEDTLS_X509_SAN_RFC822_NAME:
            {
                const char *dns_name = "dNSName";
                const char *rfc822_name = "rfc822Name";

                ret = mbedtls_snprintf(p, n,
                                       "\n%s    %s : ",
                                       prefix,
                                       san.type ==
                                       MBEDTLS_X509_SAN_DNS_NAME ? dns_name : rfc822_name);
                MBEDTLS_X509_SAFE_SNPRINTF;
                if (san.san.unstructured_name.len >= n) {
                    if (n > 0) {
                        *p = '\0';
                    }
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }

                memcpy(p, san.san.unstructured_name.p, san.san.unstructured_name.len);
                p += san.san.unstructured_name.len;
                n -= san.san.unstructured_name.len;
            }
            break;
            /*
             * iPAddress
             */
            case MBEDTLS_X509_SAN_IP_ADDRESS:
            {
                ret = mbedtls_snprintf(p, n, "\n%s    %s : ",
                                       prefix, "iPAddress");
                MBEDTLS_X509_SAFE_SNPRINTF;
                if (san.san.unstructured_name.len >= n) {
                    if (n > 0) {
                        *p = '\0';
                    }
                    return MBEDTLS_ERR_X509_BUFFER_TOO_SMALL;
                }

                unsigned char *ip = san.san.unstructured_name.p;
                // Only IPv6 (16 bytes) and IPv4 (4 bytes) types are supported
                if (san.san.unstructured_name.len == 4) {
                    ret = mbedtls_snprintf(p, n, "%u.%u.%u.%u", ip[0], ip[1], ip[2], ip[3]);
                    MBEDTLS_X509_SAFE_SNPRINTF;
                } else if (san.san.unstructured_name.len == 16) {
                    ret = mbedtls_snprintf(p, n,
                                           "%X%X:%X%X:%X%X:%X%X:%X%X:%X%X:%X%X:%X%X",
                                           ip[0], ip[1], ip[2], ip[3], ip[4], ip[5], ip[6],
                                           ip[7], ip[8], ip[9], ip[10], ip[11], ip[12], ip[13],
                                           ip[14], ip[15]);
                    MBEDTLS_X509_SAFE_SNPRINTF;
                } else {
                    if (n > 0) {
                        *p = '\0';
                    }
                    return MBEDTLS_ERR_X509_BAD_INPUT_DATA;
                }
            }
            break;
            /*
             * directoryName
             */
            case MBEDTLS_X509_SAN_DIRECTORY_NAME:
            {
                ret = mbedtls_snprintf(p, n, "\n%s    directoryName : ", prefix);
                if (ret < 0 || (size_t) ret >= n) {
                    mbedtls_x509_free_subject_alt_name(&san);
                }

                MBEDTLS_X509_SAFE_SNPRINTF;
                ret = mbedtls_x509_dn_gets(p, n, &san.san.directory_name);

                if (ret < 0) {
                    mbedtls_x509_free_subject_alt_name(&san);
                    if (n > 0) {
                        *p = '\0';
                    }
                    return ret;
                }

                p += ret;
                n -= ret;
            }
            break;
            /*
             * Type not supported, skip item.
             */
            default:
                ret = mbedtls_snprintf(p, n, "\n%s    <unsupported>", prefix);
                MBEDTLS_X509_SAFE_SNPRINTF;
                break;
        }

        /* So far memory is freed only in the case of directoryName
         * parsing succeeding, as mbedtls_x509_get_name allocates memory. */
        mbedtls_x509_free_subject_alt_name(&san);
        cur = cur->next;
    }

    *p = '\0';

    *size = n;
    *buf = p;

    return 0;
}